

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_file.hpp
# Opt level: O2

bool iutest::detail::IFileSystem::ReadAll(char *filename,string *dst)

{
  int iVar1;
  IFile *ptr;
  string asStack_38 [32];
  
  ptr = New();
  if (ptr != (IFile *)0x0) {
    iVar1 = (*(ptr->super_IOutStream)._vptr_IOutStream[5])(ptr,filename,1);
    if ((char)iVar1 != '\0') {
      (*(ptr->super_IInStream)._vptr_IInStream[4])(asStack_38,&ptr->super_IInStream);
      std::__cxx11::string::operator=((string *)dst,asStack_38);
      std::__cxx11::string::~string(asStack_38);
      Free(ptr);
      return true;
    }
    Free(ptr);
  }
  return false;
}

Assistant:

static bool ReadAll(const char* filename, ::std::string& dst)
    {
        IFile* fp = detail::IFileSystem::New();
        if(fp == NULL)
        {
            return false;
        }

        if(!fp->Open(filename, IFile::OpenRead))
        {
            detail::IFileSystem::Free(fp);
            return false;
        }

        dst = fp->ReadAll();
        detail::IFileSystem::Free(fp);
        return true;
    }